

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::csharp::UnderscoresToCamelCase
                   (string *__return_storage_ptr__,string *input,bool cap_next_letter,
                   bool preserve_period)

{
  ulong uVar1;
  char *pcVar2;
  int local_20;
  byte local_19;
  int i;
  bool preserve_period_local;
  bool cap_next_letter_local;
  string *input_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_19 = cap_next_letter;
  for (local_20 = 0; uVar1 = std::__cxx11::string::size(), (ulong)(long)local_20 < uVar1;
      local_20 = local_20 + 1) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input);
    if ((*pcVar2 < 'a') ||
       (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input), 'z' < *pcVar2)) {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input);
      if ((*pcVar2 < 'A') ||
         (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input), 'Z' < *pcVar2)) {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input);
        if ((*pcVar2 < '0') ||
           (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input), '9' < *pcVar2)) {
          pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input);
          if ((*pcVar2 == '.') && (preserve_period)) {
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'.');
          }
        }
        else {
          pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input);
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar2);
        }
        local_19 = 1;
      }
      else {
        if ((local_20 == 0) && ((local_19 & 1) == 0)) {
          pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input);
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar2 + ' ');
        }
        else {
          pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input);
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar2);
        }
        local_19 = 0;
      }
    }
    else {
      if ((local_19 & 1) == 0) {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar2);
      }
      else {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar2 + -0x20);
      }
      local_19 = 0;
    }
  }
  std::__cxx11::string::size();
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input);
  if (*pcVar2 == '#') {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'_');
  }
  return __return_storage_ptr__;
}

Assistant:

std::string UnderscoresToCamelCase(const std::string& input,
                                   bool cap_next_letter,
                                   bool preserve_period) {
  string result;
  // Note:  I distrust ctype.h due to locales.
  for (int i = 0; i < input.size(); i++) {
    if ('a' <= input[i] && input[i] <= 'z') {
      if (cap_next_letter) {
        result += input[i] + ('A' - 'a');
      } else {
        result += input[i];
      }
      cap_next_letter = false;
    } else if ('A' <= input[i] && input[i] <= 'Z') {
      if (i == 0 && !cap_next_letter) {
        // Force first letter to lower-case unless explicitly told to
        // capitalize it.
        result += input[i] + ('a' - 'A');
      } else {
        // Capital letters after the first are left as-is.
        result += input[i];
      }
      cap_next_letter = false;
    } else if ('0' <= input[i] && input[i] <= '9') {
      result += input[i];
      cap_next_letter = true;
    } else {
      cap_next_letter = true;
      if (input[i] == '.' && preserve_period) {
        result += '.';
      }
    }
  }
  // Add a trailing "_" if the name should be altered.
  if (input[input.size() - 1] == '#') {
    result += '_';
  }
  return result;
}